

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

void __thiscall OpenMD::LJ::addType(LJ *this,AtomType *atomType)

{
  bool bVar1;
  size_type sVar2;
  _Rb_tree_const_iterator<int> this_00;
  undefined8 uVar3;
  reference pvVar4;
  reference piVar5;
  reference pvVar6;
  reference pvVar7;
  AtomType *in_RSI;
  AtomType *in_RDI;
  AtomType *atomType1;
  AtomType *atomType2;
  double dVar8;
  RealType RVar9;
  RealType RVar10;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  LJInteractionData mixer;
  AtomType *atype2;
  int ljtid2;
  iterator it;
  RealType s;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int ljtid;
  int atid;
  AtomType *in_stack_ffffffffffffff18;
  _Base_ptr in_stack_ffffffffffffff20;
  LJ *this_01;
  uint7 uStack_9f;
  AtomType *in_stack_ffffffffffffff68;
  int ident;
  undefined4 in_stack_ffffffffffffff70;
  value_type vVar12;
  _Self local_88;
  _Base_ptr local_80;
  _Rb_tree_const_iterator<int> local_78;
  string local_70 [24];
  AtomType *in_stack_ffffffffffffffa8;
  AtomType *in_stack_ffffffffffffffb0;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_38;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_28;
  value_type local_18;
  uint local_14;
  
  local_14 = AtomType::getIdent(in_RSI);
  this_01 = (LJ *)&in_RDI->mass_;
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a9f6b);
  local_18 = (value_type)sVar2;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_ffffffffffffff20);
  pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01,
                      (value_type_conflict1 *)in_RDI);
  this_00 = pVar11.first._M_node;
  local_38.second = pVar11.second;
  local_38.first._M_node = this_00._M_node;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_28,&local_38);
  if ((local_28.second & 1U) == 0) {
    snprintf(painCave.errMsg,2000,"LJ already had a previous entry with ident %d\n",(ulong)local_14)
    ;
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  atomType1 = (AtomType *)
              getSigma((LJ *)this_00._M_node,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  atomType2 = (AtomType *)((ulong)atomType1 & 0x7fffffffffffffff);
  dVar8 = std::numeric_limits<double>::epsilon();
  if ((double)atomType2 < dVar8) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "Lennard-Jones atom %s was defined with a sigma value (%f)\n\tthat was too close to zero."
             ,atomType1,uVar3);
    std::__cxx11::string::~string(local_70);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  vVar12 = local_18;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&in_RDI->base_,(long)(int)local_14);
  *pvVar4 = vVar12;
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                *)&(in_RDI->everyZIG).
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_18);
  std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
            ((vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_> *)
             this_01,(size_type)in_RDI);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_78);
  local_80 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff18)
  ;
  local_78._M_node = local_80;
  while( true ) {
    ident = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    local_88._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
    bVar1 = std::operator!=(&local_78,&local_88);
    if (!bVar1) break;
    in_stack_ffffffffffffff18 = (AtomType *)&in_RDI->base_;
    piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff20);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18,(long)*piVar5
                       );
    vVar12 = *pvVar4;
    in_stack_ffffffffffffff20 =
         (in_RDI->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff68 =
         ForceField::getAtomType((ForceField *)CONCAT44(vVar12,in_stack_ffffffffffffff70),ident);
    RVar9 = getSigma((LJ *)this_00._M_node,atomType1,in_stack_ffffffffffffffa8);
    RVar10 = getEpsilon(this_01,in_RDI,atomType2);
    std::
    vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                  *)&(in_RDI->everyZIG).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(long)vVar12);
    std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
              ((vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_> *)
               this_01,(size_type)in_RDI);
    pvVar6 = std::
             vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                           *)&(in_RDI->everyZIG).
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_18);
    pvVar7 = std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::
             operator[](pvVar6,(long)vVar12);
    pvVar7->sigma = RVar9;
    pvVar7->epsilon = RVar10;
    pvVar7->sigmai = 1.0 / RVar9;
    *(ulong *)&pvVar7->explicitlySet = (ulong)uStack_9f << 8;
    if (vVar12 != local_18) {
      pvVar6 = std::
               vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
               ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                             *)&(in_RDI->everyZIG).
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)vVar12);
      pvVar7 = std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::
               operator[](pvVar6,(long)local_18);
      pvVar7->sigma = RVar9;
      pvVar7->epsilon = RVar10;
      pvVar7->sigmai = 1.0 / RVar9;
      *(ulong *)&pvVar7->explicitlySet = (ulong)uStack_9f << 8;
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void LJ::addType(AtomType* atomType) {
    // add it to the map:
    int atid  = atomType->getIdent();
    int ljtid = LJtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = LJtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LJ already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    // Check to make sure the 1/sigma won't cause problems later:
    RealType s = getSigma(atomType, atomType);
    if (fabs(s) < std::numeric_limits<RealType>::epsilon()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Lennard-Jones atom %s was defined with a sigma value (%f)\n"
               "\tthat was too close to zero.",
               atomType->getName().c_str(), s);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    LJtids[atid] = ljtid;
    MixingMap[ljtid].resize(nLJ_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = LJtypes.begin(); it != LJtypes.end(); ++it) {
      int ljtid2       = LJtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      LJInteractionData mixer;
      mixer.sigma         = getSigma(atomType, atype2);
      mixer.epsilon       = getEpsilon(atomType, atype2);
      mixer.sigmai        = 1.0 / mixer.sigma;
      mixer.explicitlySet = false;
      MixingMap[ljtid2].resize(nLJ_);

      MixingMap[ljtid][ljtid2] = mixer;
      if (ljtid2 != ljtid) { MixingMap[ljtid2][ljtid] = mixer; }
    }
  }